

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexWriter.cpp
# Opt level: O3

void __thiscall Ptex::v2_2::PtexMainWriter::writeMetaData(PtexMainWriter *this,FILE *fp)

{
  uint32_t *puVar1;
  uint64_t *puVar2;
  MetaEntry *val;
  pointer pMVar3;
  void *data;
  undefined8 *puVar4;
  bool bVar5;
  uint32_t uVar6;
  int iVar7;
  pointer pcVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  int i;
  ulong uVar12;
  uint8_t keysize;
  uint8_t datatype;
  uint32_t datasize;
  uint32_t zipsize;
  vector<Ptex::v2_2::PtexWriterBase::MetaEntry_*,_std::allocator<Ptex::v2_2::PtexWriterBase::MetaEntry_*>_>
  lmdEntries;
  vector<unsigned_int,_std::allocator<unsigned_int>_> lmdzipsize;
  vector<long,_std::allocator<long>_> lmdoffset;
  byte local_82;
  undefined1 local_81;
  int local_80;
  uint local_7c;
  void *local_78;
  long lStack_70;
  long local_68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  vector<long,_std::allocator<long>_> local_48;
  
  local_78 = (void *)0x0;
  lStack_70 = 0;
  local_68 = 0;
  uVar11 = (uint)((ulong)((long)(this->super_PtexWriterBase)._metadata.
                                super__Vector_base<Ptex::v2_2::PtexWriterBase::MetaEntry,_std::allocator<Ptex::v2_2::PtexWriterBase::MetaEntry>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->super_PtexWriterBase)._metadata.
                               super__Vector_base<Ptex::v2_2::PtexWriterBase::MetaEntry,_std::allocator<Ptex::v2_2::PtexWriterBase::MetaEntry>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 6);
  if (0 < (int)uVar11) {
    uVar12 = (ulong)(uVar11 & 0x7fffffff);
    lVar10 = 0;
    do {
      pMVar3 = (this->super_PtexWriterBase)._metadata.
               super__Vector_base<Ptex::v2_2::PtexWriterBase::MetaEntry,_std::allocator<Ptex::v2_2::PtexWriterBase::MetaEntry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      val = (MetaEntry *)((long)&(pMVar3->key)._M_dataplus._M_p + lVar10);
      if (*(int *)((long)&(pMVar3->data).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  + lVar10 + 8) -
          *(int *)((long)&(pMVar3->data).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  + lVar10) < 0x401) {
        iVar7 = PtexWriterBase::writeMetaDataBlock(&this->super_PtexWriterBase,fp,val);
        puVar1 = &(this->super_PtexWriterBase)._header.metadatamemsize;
        *puVar1 = *puVar1 + iVar7;
      }
      else {
        local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)val;
        std::
        vector<Ptex::v2_2::PtexWriterBase::MetaEntry*,std::allocator<Ptex::v2_2::PtexWriterBase::MetaEntry*>>
        ::emplace_back<Ptex::v2_2::PtexWriterBase::MetaEntry*>
                  ((vector<Ptex::v2_2::PtexWriterBase::MetaEntry*,std::allocator<Ptex::v2_2::PtexWriterBase::MetaEntry*>>
                    *)&local_78,(MetaEntry **)&local_48);
      }
      lVar10 = lVar10 + 0x40;
      uVar12 = uVar12 - 1;
    } while (uVar12 != 0);
  }
  if ((this->super_PtexWriterBase)._header.metadatamemsize != 0) {
    uVar6 = PtexWriterBase::writeZipBlock(&this->super_PtexWriterBase,fp,(void *)0x0,0,true);
    (this->super_PtexWriterBase)._header.metadatazipsize = uVar6;
  }
  if ((this->super_PtexWriterBase)._ok == true) {
    uVar11 = 8;
    do {
      uVar9 = 0x4000;
      if (uVar11 < 0x4000) {
        uVar9 = uVar11;
      }
      iVar7 = PtexWriterBase::writeBlock
                        (&this->super_PtexWriterBase,fp,PtexWriterBase::writeBlank::zeros,uVar9);
      uVar9 = uVar11 - iVar7;
      bVar5 = iVar7 <= (int)uVar11;
      uVar11 = uVar9;
    } while (uVar9 != 0 && bVar5);
  }
  uVar11 = (uint)(lStack_70 - (long)local_78 >> 3);
  if (0 < (int)uVar11) {
    std::vector<long,_std::allocator<long>_>::vector
              (&local_48,(ulong)(uVar11 & 0x7fffffff),(allocator_type *)&local_60);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_60,(ulong)(uVar11 & 0x7fffffff),(allocator_type *)&local_80);
    uVar12 = 0;
    do {
      lVar10 = *(long *)((long)local_78 + uVar12 * 8);
      pcVar8 = (pointer)ftello((FILE *)this->_tmpfp);
      (&((string *)
        local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start)->_M_dataplus)[uVar12]._M_p = pcVar8;
      data = *(void **)(lVar10 + 0x28);
      uVar9 = PtexWriterBase::writeZipBlock
                        (&this->super_PtexWriterBase,this->_tmpfp,data,
                         *(int *)(lVar10 + 0x30) - (int)data,true);
      local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar12] = uVar9;
      uVar12 = uVar12 + 1;
    } while ((uVar11 & 0x7fffffff) != uVar12);
    uVar12 = 0;
    do {
      puVar4 = *(undefined8 **)((long)local_78 + uVar12 * 8);
      local_82 = *(char *)(puVar4 + 1) + 1;
      local_81 = *(undefined1 *)(puVar4 + 4);
      local_80 = *(int *)(puVar4 + 6) - *(int *)(puVar4 + 5);
      local_7c = local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar12];
      PtexWriterBase::writeZipBlock(&this->super_PtexWriterBase,fp,&local_82,1,false);
      PtexWriterBase::writeZipBlock
                (&this->super_PtexWriterBase,fp,(void *)*puVar4,(uint)local_82,false);
      PtexWriterBase::writeZipBlock(&this->super_PtexWriterBase,fp,&local_81,1,false);
      PtexWriterBase::writeZipBlock(&this->super_PtexWriterBase,fp,&local_80,4,false);
      PtexWriterBase::writeZipBlock(&this->super_PtexWriterBase,fp,&local_7c,4,false);
      (this->super_PtexWriterBase)._extheader.lmdheadermemsize =
           (uint)local_82 + (this->super_PtexWriterBase)._extheader.lmdheadermemsize + 10;
      uVar12 = uVar12 + 1;
    } while ((uVar11 & 0x7fffffff) != uVar12);
    uVar6 = PtexWriterBase::writeZipBlock(&this->super_PtexWriterBase,fp,(void *)0x0,0,true);
    (this->super_PtexWriterBase)._extheader.lmdheaderzipsize = uVar6;
    uVar12 = 0;
    do {
      iVar7 = PtexWriterBase::copyBlock
                        (&this->super_PtexWriterBase,fp,this->_tmpfp,
                         (FilePos)(&((string *)
                                    local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl
                                    .super__Vector_impl_data._M_start)->_M_dataplus)[uVar12]._M_p,
                         local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar12]);
      puVar2 = &(this->super_PtexWriterBase)._extheader.lmddatasize;
      *puVar2 = *puVar2 + (long)iVar7;
      uVar12 = uVar12 + 1;
    } while ((uVar11 & 0x7fffffff) != uVar12);
    if (local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((MetaEntry *)
        local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start != (MetaEntry *)0x0) {
      operator_delete(local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  if (local_78 != (void *)0x0) {
    operator_delete(local_78,local_68 - (long)local_78);
  }
  return;
}

Assistant:

void PtexMainWriter::writeMetaData(FILE* fp)
{
    std::vector<MetaEntry*> lmdEntries; // large meta data items

    // write small meta data items in a single zip block
    for (int i = 0, n = (int)_metadata.size(); i < n; i++) {
        MetaEntry& e = _metadata[i];
#ifndef PTEX_NO_LARGE_METADATA_BLOCKS
        if (int(e.data.size()) > MetaDataThreshold) {
            // skip large items, but record for later
            lmdEntries.push_back(&e);
        }
        else
#endif
    {
            // add small item to zip block
            _header.metadatamemsize += writeMetaDataBlock(fp, e);
        }
    }
    if (_header.metadatamemsize) {
        // finish zip block
        _header.metadatazipsize = writeZipBlock(fp, 0, 0, /*finish*/ true);
    }

    // write compatibility barrier
    writeBlank(fp, sizeof(uint64_t));

    // write large items as separate blocks
    int nLmd = (int)lmdEntries.size();
    if (nLmd > 0) {
        // write data records to tmp file and accumulate zip sizes for lmd header
        std::vector<FilePos> lmdoffset(nLmd);
        std::vector<uint32_t> lmdzipsize(nLmd);
        for (int i = 0; i < nLmd; i++) {
            MetaEntry* e= lmdEntries[i];
            lmdoffset[i] = ftello(_tmpfp);
            lmdzipsize[i] = writeZipBlock(_tmpfp, &e->data[0], (int)e->data.size());
        }

        // write lmd header records as single zip block
        for (int i = 0; i < nLmd; i++) {
            MetaEntry* e = lmdEntries[i];
            uint8_t keysize = uint8_t(e->key.size()+1);
            uint8_t datatype = e->datatype;
            uint32_t datasize = (uint32_t)e->data.size();
            uint32_t zipsize = lmdzipsize[i];

            writeZipBlock(fp, &keysize, sizeof(keysize), false);
            writeZipBlock(fp, e->key.c_str(), keysize, false);
            writeZipBlock(fp, &datatype, sizeof(datatype), false);
            writeZipBlock(fp, &datasize, sizeof(datasize), false);
            writeZipBlock(fp, &zipsize, sizeof(zipsize), false);
            _extheader.lmdheadermemsize +=
                (uint32_t)(sizeof(keysize) + (size_t)keysize + sizeof(datatype) +
                           sizeof(datasize) + sizeof(zipsize));
        }
        _extheader.lmdheaderzipsize = writeZipBlock(fp, 0, 0, /*finish*/ true);

        // copy data records
        for (int i = 0; i < nLmd; i++) {
            _extheader.lmddatasize +=
                copyBlock(fp, _tmpfp, lmdoffset[i], lmdzipsize[i]);
        }
    }
}